

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O2

int coda_cursor_get_array_dim(coda_cursor *cursor,int *num_dims,long *dim)

{
  coda_backend cVar1;
  int iVar2;
  coda_type *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar3 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar3 == (coda_type *)0x0)) {
    pcVar5 = "invalid cursor argument (%s:%u)";
    uVar4 = 0x890;
  }
  else {
    if (num_dims != (int *)0x0 && dim != (long *)0x0) {
      cVar1 = pcVar3->format;
      if (99 < cVar1) {
        pcVar3 = *(coda_type **)&pcVar3->type_class;
      }
      if (pcVar3->type_class == coda_array_class) {
        switch(cVar1) {
        case coda_backend_memory:
          iVar2 = coda_mem_cursor_get_array_dim(cursor,num_dims,dim);
          return iVar2;
        case coda_backend_hdf4:
          iVar2 = -0xb;
          break;
        case coda_backend_hdf5:
          iVar2 = -0xd;
          break;
        case coda_backend_cdf:
          iVar2 = coda_cdf_cursor_get_array_dim(cursor,num_dims,dim);
          return iVar2;
        case coda_backend_netcdf:
          iVar2 = coda_netcdf_cursor_get_array_dim(cursor,num_dims,dim);
          return iVar2;
        case coda_backend_grib:
          iVar2 = coda_grib_cursor_get_array_dim(cursor,num_dims,dim);
          return iVar2;
        default:
          if (cVar1 < 2) {
            iVar2 = coda_ascbin_cursor_get_array_dim(cursor,num_dims,dim);
            return iVar2;
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                        ,0x8be,"int coda_cursor_get_array_dim(const coda_cursor *, int *, long *)");
        }
        coda_set_error(iVar2,(char *)0x0);
        return -1;
      }
      pcVar5 = coda_type_get_class_name(pcVar3->type_class);
      coda_set_error(-0x69,"cursor does not refer to an array (current type is %s)",pcVar5);
      return -1;
    }
    pcVar5 = "dimension argument(s) are NULL (%s:%u)";
    uVar4 = 0x895;
  }
  coda_set_error(-100,pcVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                 ,uVar4);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_get_array_dim(const coda_cursor *cursor, int *num_dims, long dim[])
{
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (num_dims == NULL || dim == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dimension argument(s) are NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
        case coda_backend_binary:
            return coda_ascbin_cursor_get_array_dim(cursor, num_dims, dim);
        case coda_backend_memory:
            return coda_mem_cursor_get_array_dim(cursor, num_dims, dim);
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_cursor_get_array_dim(cursor, num_dims, dim);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_cursor_get_array_dim(cursor, num_dims, dim);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            return coda_cdf_cursor_get_array_dim(cursor, num_dims, dim);
        case coda_backend_netcdf:
            return coda_netcdf_cursor_get_array_dim(cursor, num_dims, dim);
        case coda_backend_grib:
            return coda_grib_cursor_get_array_dim(cursor, num_dims, dim);
    }

    assert(0);
    exit(1);
}